

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerCPP::argument_decl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerCPP *this,Parameter *arg)

{
  SPIRType *type;
  SPIRVariable *pSVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  ulong uVar3;
  string base;
  string variable_name;
  char (*in_stack_ffffffffffffff38) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  type = Compiler::expression_type((Compiler *)this,(arg->id).id);
  pcVar2 = "";
  if (arg->write_count == 0) {
    pcVar2 = "const ";
  }
  if (type->pointer == false) {
    pcVar2 = "const ";
  }
  pSVar1 = Variant::get<spirv_cross::SPIRVariable>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr + (arg->id).id);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_b0,this,type,0);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
            (&local_70,this,(ulong)(pSVar1->super_IVariant).self.id,1);
  if ((this->super_CompilerGLSL).super_Compiler.variable_remap_callback.super__Function_base.
      _M_manager != (_Manager_type)0x0) {
    (*(this->super_CompilerGLSL).super_Compiler.variable_remap_callback._M_invoker)
              ((_Any_data *)&(this->super_CompilerGLSL).super_Compiler.variable_remap_callback,type,
               &local_70,&local_b0);
  }
  if ((type->array).super_VectorView<unsigned_int>.buffer_size != 0) {
    uVar3 = 0;
    do {
      CompilerGLSL::to_array_size_abi_cxx11_
                (&local_90,&this->super_CompilerGLSL,type,(uint32_t)uVar3);
      in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d188a;
      join<char_const(&)[12],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
                (&local_50,(spirv_cross *)"std::array<",(char (*) [12])&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d07c3,
                 (char (*) [3])&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d188a,
                 in_stack_ffffffffffffff38);
      ::std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      uVar3 = (ulong)((uint32_t)uVar3 + 1);
    } while (uVar3 < (type->array).super_VectorView<unsigned_int>.buffer_size);
  }
  local_50._M_dataplus._M_p = pcVar2;
  join<char_const*,std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&>
            (__return_storage_ptr__,(spirv_cross *)&local_50,(char **)&local_b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d002b,
             (char (*) [3])&local_70,in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerCPP::argument_decl(const SPIRFunction::Parameter &arg)
{
	auto &type = expression_type(arg.id);
	bool constref = !type.pointer || arg.write_count == 0;

	auto &var = get<SPIRVariable>(arg.id);

	string base = type_to_glsl(type);
	string variable_name = to_name(var.self);
	remap_variable_type_name(type, variable_name, base);

	for (uint32_t i = 0; i < type.array.size(); i++)
		base = join("std::array<", base, ", ", to_array_size(type, i), ">");

	return join(constref ? "const " : "", base, " &", variable_name);
}